

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpsctl.c
# Opt level: O1

slReturn nmeaBaudRateSynchronizer(int fdPort,int maxTimeMs,int verbosity)

{
  errInfo error;
  errInfo error_00;
  _Bool _Var1;
  char cVar2;
  int iVar3;
  uint uVar4;
  longlong lVar5;
  slReturn pvVar6;
  longlong lVar7;
  slReturn value;
  void *pvVar8;
  errorInfo_slReturn *peVar9;
  bool bVar10;
  errorInfo_slReturn *unaff_R12;
  bool bVar11;
  byte local_7a;
  byte local_79;
  uint local_78;
  errorInfo_slReturn local_70;
  errorInfo_slReturn local_50;
  
  lVar5 = currentTimeMs();
  pvVar6 = flushRx(fdPort);
  _Var1 = isErrorReturn(pvVar6);
  if (_Var1) {
    unaff_R12 = &local_50;
    createErrorInfo(unaff_R12,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/gpsctl.c"
                    ,"nmeaBaudRateSynchronizer",0x7b,pvVar6);
    error.fileName = local_50.fileName;
    error.cause = local_50.cause;
    error.functionName = local_50.functionName;
    error.lineNumber = local_50.lineNumber;
    error._28_4_ = local_50._28_4_;
    makeErrorMsgReturn(error,"could not flush receiver prior to synchronization");
  }
  local_78 = 0;
  bVar10 = false;
  do {
    lVar7 = currentTimeMs();
    if (lVar5 + maxTimeMs <= lVar7) {
      pvVar6 = makeOkInfoReturn((void *)0x0);
      return pvVar6;
    }
    peVar9 = (errorInfo_slReturn *)((ulong)unaff_R12 & 0xffffffff);
    lVar7 = currentTimeMs();
    value = readSerialChar(fdPort,(lVar5 + maxTimeMs) - lVar7);
    _Var1 = isErrorReturn(value);
    if (_Var1) {
      createErrorInfo(&local_70,
                      "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/gpsctl.c"
                      ,"nmeaBaudRateSynchronizer",0x82,value);
      error_00.fileName = local_70.fileName;
      error_00.cause = local_70.cause;
      error_00.functionName = local_70.functionName;
      error_00.lineNumber = local_70.lineNumber;
      error_00._28_4_ = local_70._28_4_;
      pvVar6 = makeErrorMsgReturn(error_00,"problem reading a character while synchronizing");
      bVar11 = false;
    }
    else {
      _Var1 = isWarningReturn(value);
      if (_Var1) {
        bVar11 = false;
        pvVar6 = makeOkInfoReturn((void *)0x0);
      }
      else {
        pvVar8 = getReturnInfo(value);
        cVar2 = (char)pvVar8;
        if (bVar10) {
          if ((cVar2 == '\r') || (((uint)pvVar8 & 0xff) == 10)) {
            if (local_79 == 0x2a) {
              iVar3 = hex2int(local_7a);
              bVar11 = true;
              if ((-1 < iVar3) && (uVar4 = hex2int((char)peVar9), -1 < (int)uVar4)) {
                local_78 = local_78 ^ (int)(char)((byte)unaff_R12 ^ local_7a) ^ 0x2a;
                bVar11 = (uVar4 | iVar3 << 4) != local_78;
                if (!bVar11) {
                  pvVar6 = makeOkInfoReturn((void *)0x1);
                }
              }
              if (bVar11) {
                bVar10 = false;
              }
            }
            else {
              bVar11 = true;
              bVar10 = false;
              peVar9 = (errorInfo_slReturn *)((ulong)unaff_R12 & 0xffffffff);
            }
          }
          else {
            local_78 = local_78 ^ (int)cVar2;
            bVar11 = true;
            local_79 = local_7a;
            local_7a = (byte)(errorInfo_slReturn *)((ulong)unaff_R12 & 0xffffffff);
            peVar9 = (errorInfo_slReturn *)((ulong)pvVar8 & 0xffffffff);
          }
        }
        else {
          if (cVar2 == '$') {
            local_78 = 0;
            bVar10 = true;
          }
          bVar11 = true;
        }
      }
    }
    unaff_R12 = peVar9;
  } while (bVar11);
  return pvVar6;
}

Assistant:

static slReturn nmeaBaudRateSynchronizer(int fdPort, int maxTimeMs, int verbosity) {

    bool inLine = false;
    char last[3];
    int cksm = 0;
    long long start = currentTimeMs();

    // flush any junk we might have in the receiver buffer...
    slReturn frResp = flushRx(fdPort);
    if (isErrorReturn(frResp))
        makeErrorMsgReturn(ERR_CAUSE(frResp), "could not flush receiver prior to synchronization");

    // read characters until either we appear to be synchronized or we run out of time...
    while (currentTimeMs() < start + maxTimeMs) {

        slReturn rscResp = readSerialChar(fdPort, start + maxTimeMs - currentTimeMs());
        if (isErrorReturn(rscResp))
            return makeErrorMsgReturn(ERR_CAUSE(rscResp), "problem reading a character while synchronizing");
        if (isWarningReturn(rscResp))
            return makeOkInfoReturn(bool2info(false));

        char c = getReturnInfoChar(rscResp);
        if (inLine) {
            if ((c == '\r') || (c == '\n')) {
                if (last[0] == '*') {
                    int un = hex2int(last[1]);
                    if (un >= 0) {
                        int ln = hex2int(last[2]);
                        if (ln >= 0) {
                            int ck = (un << 4) | ln;

                            // correct checksum for the last three characters received...
                            cksm ^= last[0];
                            cksm ^= last[1];
                            cksm ^= last[2];

                            if (ck == cksm) {
                                return makeOkInfoReturn(bool2info(true));
                            }
                        }
                    }
                }
                inLine = false;
            }
            else {
                cksm ^= c;
                last[0] = last[1];
                last[1] = last[2];
                last[2] = c;
            }
        }
        else if (c == '$') {
            inLine = true;
            cksm = 0;
        }
    }
    return makeOkInfoReturn(bool2info(false));
}